

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

void __thiscall xercesc_4_0::XMLDateTime::normalize(XMLDateTime *this)

{
  int iVar1;
  div_t dVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  
  if ((uint)this->fValue[7] < 2) {
    return;
  }
  iVar6 = (uint)(this->fValue[7] != 2) * 2 + -1;
  iVar7 = this->fValue[1];
  dVar2 = div(iVar7 + -1,0xc);
  iVar1 = dVar2.quot;
  iVar7 = iVar7 + iVar1 * -0xc;
  this->fValue[1] = iVar7;
  if (iVar7 < 1) {
    this->fValue[1] = iVar7 + 0xc;
    iVar1 = iVar1 + -1;
  }
  this->fValue[0] = this->fValue[0] + iVar1;
  iVar7 = this->fTimeZone[1] * iVar6 + this->fValue[4];
  dVar2 = div(iVar7,0x3c);
  iVar1 = dVar2.quot;
  iVar7 = iVar1 * -0x3c + iVar7;
  this->fValue[4] = iVar7;
  if (iVar7 < 0) {
    this->fValue[4] = iVar7 + 0x3c;
    iVar1 = iVar1 + -1;
  }
  iVar1 = iVar1 + this->fValue[3] + iVar6 * this->fTimeZone[0];
  dVar2 = div(iVar1,0x18);
  iVar7 = dVar2.quot;
  iVar1 = iVar1 + iVar7 * -0x18;
  this->fValue[3] = iVar1;
  if (iVar1 < 0) {
    this->fValue[3] = iVar1 + 0x18;
    iVar7 = iVar7 + -1;
  }
  iVar7 = iVar7 + this->fValue[2];
  this->fValue[2] = iVar7;
  uVar4 = this->fValue[0];
  uVar5 = this->fValue[1];
  do {
    if (uVar5 < 0xc) {
      iVar1 = 0x1e;
      if ((0xa50U >> (uVar5 & 0x1f) & 1) == 0) {
        if (uVar5 != 2) goto LAB_002530da;
        iVar1 = 0x1c;
        if ((uVar4 & 3) == 0) {
          uVar3 = uVar4 * -0x3d70a3d7 + 0x51eb850;
          iVar1 = 0x1d;
          if ((uVar3 >> 2 | uVar4 * 0x40000000) < 0x28f5c29) {
            iVar1 = ((uVar3 >> 4 | uVar4 * -0x70000000) < 0xa3d70b) + 0x1c;
          }
        }
      }
    }
    else {
LAB_002530da:
      iVar1 = 0x1f;
    }
    if (iVar7 < 1) {
      if (uVar5 < 0xd) {
        iVar1 = 0x1e;
        if ((0x14a0U >> (uVar5 & 0x1f) & 1) == 0) {
          if (uVar5 != 3) goto LAB_00253130;
          iVar1 = 0x1c;
          if ((uVar4 & 3) == 0) {
            uVar3 = uVar4 * -0x3d70a3d7 + 0x51eb850;
            iVar1 = 0x1d;
            if ((uVar3 >> 2 | uVar4 * 0x40000000) < 0x28f5c29) {
              iVar1 = ((uVar3 >> 4 | uVar4 * -0x70000000) < 0xa3d70b) + 0x1c;
            }
          }
        }
      }
      else {
LAB_00253130:
        iVar1 = 0x1f;
      }
      iVar7 = iVar7 + iVar1;
      iVar6 = -1;
    }
    else {
      if (iVar7 - iVar1 == 0 || iVar7 < iVar1) {
        this->fValue[7] = 1;
        return;
      }
      iVar6 = 1;
      iVar7 = iVar7 - iVar1;
    }
    this->fValue[2] = iVar7;
    dVar2 = div(iVar6 + uVar5 + -1,0xc);
    uVar5 = iVar6 + uVar5 + dVar2.quot * -0xc;
    this->fValue[1] = uVar5;
    if ((int)uVar5 < 1) {
      uVar5 = uVar5 + 0xc;
      this->fValue[1] = uVar5;
      uVar4 = uVar4 - 1;
      this->fValue[0] = uVar4;
    }
    uVar4 = uVar4 + dVar2.quot;
    this->fValue[0] = uVar4;
  } while( true );
}

Assistant:

void XMLDateTime::normalize()
{

    if ((fValue[utc] == UTC_UNKNOWN) ||
        (fValue[utc] == UTC_STD)      )
        return;

    int negate = (fValue[utc] == UTC_POS)? -1: 1;
    int temp;
    int carry;


    // we normalize a duration so could have 200M...
    //update months (may be modified additionaly below)
    temp = fValue[Month];
    fValue[Month] = modulo(temp, 1, 13);
    carry = fQuotient(temp, 1, 13);
    if (fValue[Month] <= 0) {
        fValue[Month]+= 12;
        carry--;
    }

    //add years (may be modified additionaly below)
    fValue[CentYear] += carry;

    // add mins
    temp = fValue[Minute] + negate * fTimeZone[mm];
    carry = fQuotient(temp, 60);
    fValue[Minute] = mod(temp, 60, carry);
    if (fValue[Minute] < 0) {
        fValue[Minute] += 60;
        carry--;
    }

    //add hours
    temp = fValue[Hour] + negate * fTimeZone[hh] + carry;
    carry = fQuotient(temp, 24);
    fValue[Hour] = mod(temp, 24, carry);
    if (fValue[Hour] < 0) {
        fValue[Hour] += 24;
        carry--;
    }

    fValue[Day] += carry;

    while (1)
    {
        temp = maxDayInMonthFor(fValue[CentYear], fValue[Month]);
        if (fValue[Day] < 1)
        {
            fValue[Day] += maxDayInMonthFor(fValue[CentYear], fValue[Month] - 1);
            carry = -1;
        }
        else if ( fValue[Day] > temp )
        {
            fValue[Day] -= temp;
            carry = 1;
        }
        else
        {
            break;
        }

        temp = fValue[Month] + carry;
        fValue[Month] = modulo(temp, 1, 13);
        if (fValue[Month] <=0) {
            fValue[Month]+= 12;
            fValue[CentYear]--;
        }
        fValue[CentYear] += fQuotient(temp, 1, 13);
    }

    // set to normalized
    fValue[utc] = UTC_STD;

    return;
}